

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

uoffset_t __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::CreateUninitializedVector
          (FlatBufferBuilderImpl<false> *this,size_t len,size_t elemsize,size_t alignment,
          uint8_t **buf)

{
  type tVar1;
  uint uVar2;
  uint8_t *puVar3;
  uint vec_end;
  uoffset_t vec_start;
  uint8_t **buf_local;
  size_t alignment_local;
  size_t elemsize_local;
  size_t len_local;
  FlatBufferBuilderImpl<false> *this_local;
  
  NotNested(this);
  StartVector<flatbuffers::Offset,unsigned_int>(this,len,elemsize,alignment);
  vector_downward<unsigned_int>::make_space(&this->buf_,len * elemsize);
  tVar1 = GetSizeRelative32BitRegion<false>(this);
  uVar2 = EndVector<unsigned_int,unsigned_int>(this,len);
  puVar3 = vector_downward<unsigned_int>::data_at(&this->buf_,(ulong)tVar1);
  *buf = puVar3;
  return uVar2;
}

Assistant:

uoffset_t CreateUninitializedVector(size_t len, size_t elemsize,
                                      size_t alignment, uint8_t **buf) {
    NotNested();
    StartVector(len, elemsize, alignment);
    buf_.make_space(len * elemsize);
    const uoffset_t vec_start = GetSizeRelative32BitRegion();
    auto vec_end = EndVector(len);
    *buf = buf_.data_at(vec_start);
    return vec_end;
  }